

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

void KDict_Reftrace(KonohaContext *kctx,KDict *dict,KObjectVisitor *visitor)

{
  char *pcVar1;
  kObject_conflict *pkVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (dict->data).bytesize;
  if (0xf < uVar4) {
    uVar4 = uVar4 >> 4;
    lVar3 = 8;
    do {
      pcVar1 = (dict->data).field_1.bytebuf;
      if (*(int *)(pcVar1 + lVar3 + -4) < 0) {
        pkVar2 = *(kObject_conflict **)(pcVar1 + lVar3);
        if (pkVar2 == (kObject_conflict *)0x0) {
          __assert_fail("dict->data.keyValueItems[i].ObjectValue != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
                        ,0x143,"void KDict_Reftrace(KonohaContext *, KDict *, KObjectVisitor *)");
        }
        (*visitor->fn_visit)(visitor,pkVar2);
      }
      lVar3 = lVar3 + 0x10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

KLIBDECL void KDict_Reftrace(KonohaContext *kctx, KDict *dict, KObjectVisitor *visitor)
{
	size_t i, size = KDict_size(dict);
	for(i = 0; i < size; i++) {
		if(KTypeAttr_Is(Boxed, dict->data.keyValueItems[i].typeAttr)) {
			KRefTrace(dict->data.keyValueItems[i].ObjectValue);
		}
	}
}